

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O2

Matrix33 *
AML::eulerAngleRatesMatrix_XZX(Matrix33 *__return_storage_ptr__,double phi,double theta,double psi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_58;
  double dStack_50;
  double local_48;
  undefined8 local_40;
  double local_38;
  double dStack_30;
  undefined8 local_28;
  double local_20;
  double dStack_18;
  
  dVar1 = cos(phi);
  dVar2 = sin(phi);
  dVar3 = cos(theta);
  dVar4 = sin(theta);
  dStack_18 = 1.0 / dVar4;
  local_48 = -dVar2 * dVar3 * dStack_18;
  local_58 = dVar4 * dStack_18;
  dStack_50 = dVar1 * dVar3 * dStack_18;
  local_40 = 0;
  local_38 = dVar4 * dVar2 * dStack_18;
  dStack_30 = dVar4 * dVar1 * dStack_18;
  local_28 = 0;
  local_20 = -dVar1 * dStack_18;
  dStack_18 = dVar2 * dStack_18;
  Matrix33::Matrix33(__return_storage_ptr__,(double (*) [3])&local_58);
  return __return_storage_ptr__;
}

Assistant:

Matrix33 eulerAngleRatesMatrix_XZX(double phi, double theta, double psi)
    {
        const double cosPhi = cos(phi);
        const double sinPhi = sin(phi);
        const double cosTheta = cos(theta);
        const double sinTheta = sin(theta);
        const double cscTheta = 1.0 / sinTheta;

        double data[3][3] = { { sinTheta * cscTheta, cosPhi * cosTheta * cscTheta, -sinPhi * cosTheta * cscTheta },
                              { 0.0, sinPhi * sinTheta * cscTheta, cosPhi * sinTheta * cscTheta },
                              { 0.0, -cosPhi * cscTheta, sinPhi * cscTheta } };

        return Matrix33(data);
    }